

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O0

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::run(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
      *this,double maxDuration,bool resetPopulation)

{
  bool bVar1;
  ostream *poVar2;
  Chromosome *pCVar3;
  Logger *this_00;
  void *pvVar4;
  float fVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  duration<double,_std::ratio<1L,_1L>_> local_50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  time_point t2;
  duration<double,_std::ratio<1L,_1L>_> local_38;
  rep_conflict local_30;
  rep_conflict simulationTime;
  time_point t1;
  bool resetPopulation_local;
  double maxDuration_local;
  GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
  *this_local;
  
  t1.__d.__r._7_1_ = resetPopulation;
  if (resetPopulation) {
    reset(this);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Time");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"Fitness");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  simulationTime = (rep_conflict)std::chrono::_V2::system_clock::now();
  t2.__d.__r = std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&simulationTime,
                          (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&simulationTime);
  local_38.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           (&t2.__d);
  local_30 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_38);
  do {
    pCVar3 = Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             ::getFittestChromosome(&this->_population);
    bVar1 = isSolution(this,pCVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00105fe5;
    local_48.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_58.__r = (rep)std::chrono::operator-
                                  (&local_48,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&simulationTime);
    local_50.__r = (rep_conflict)
                   std::chrono::
                   duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                             (&local_58);
    local_30 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_50);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_30);
    poVar2 = std::operator<<(poVar2,"\t");
    pCVar3 = Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
             ::getFittestChromosome(&this->_population);
    fVar5 = Chromosome<Gen,_ComputeFitness>::getFitness(pCVar3);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,fVar5);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    step(this,(float)local_30);
  } while (local_30 < maxDuration);
  this_00 = getLogger();
  Logger::warning<char[21]>
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/rafagaitan[P]crsga/include/crsGA/GeneticAlgorithm.hpp"
             ,0xb4,(char (*) [21])"Max duration reached");
LAB_00105fe5:
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_30);
  poVar2 = std::operator<<(poVar2,"\t");
  pCVar3 = Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::getFittestChromosome(&this->_population);
  fVar5 = Chromosome<Gen,_ComputeFitness>::getFitness(pCVar3);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,fVar5);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Best:");
  pCVar3 = Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ::getFittestChromosome(&this->_population);
  poVar2 = operator<<(poVar2,pCVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void run(double maxDuration, bool resetPopulation = false)
    {
        if (resetPopulation)
            reset();
        std::cout << "Time"
                  << "\t"
                  << "Fitness" << std::endl;
        std::chrono::high_resolution_clock::time_point t1 = std::chrono::high_resolution_clock::now();
        auto simulationTime = std::chrono::duration_cast<std::chrono::duration<double>>(t1 - t1).count();
        while (!isSolution(_population.getFittestChromosome()))
        {
            std::chrono::high_resolution_clock::time_point t2 = std::chrono::high_resolution_clock::now();
            simulationTime = std::chrono::duration_cast<std::chrono::duration<double>>(t2 - t1).count();
            std::cout << simulationTime << "\t" << _population.getFittestChromosome().getFitness() << std::endl;
            step(simulationTime);
            if (simulationTime >= maxDuration)
            {
                LOG_WARNING("Max duration reached");
                break;
            }
        }
        std::cout << simulationTime << "\t" << _population.getFittestChromosome().getFitness() << std::endl;
        std::cout << "Best:" << _population.getFittestChromosome() << std::endl;
    }